

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeContainer.hpp
# Opt level: O3

ElemPtr __thiscall
OpenMD::TypeContainer<OpenMD::BendType,_3>::find
          (TypeContainer<OpenMD::BendType,_3> *this,KeyType *keys,string *wildCard)

{
  MapType *this_00;
  BendType *pBVar1;
  bool bVar2;
  iterator iVar3;
  pair<int,_OpenMD::BendType_*> *ppVar4;
  pair<int,_OpenMD::BendType_*> *ppVar5;
  _Rb_tree_header *p_Var6;
  ElemPtr pBVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer pbVar9;
  vector<std::pair<int,_OpenMD::BendType_*>,_std::allocator<std::pair<int,_OpenMD::BendType_*>_>_>
  foundTypes;
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  iterCont;
  KeyType reversedKeys;
  KeyType replacedKey;
  KeyType allWildCards;
  allocator_type local_b9;
  pair<int,_OpenMD::BendType_*> *local_b8;
  iterator iStack_b0;
  pair<int,_OpenMD::BendType_*> *local_a8;
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  key_type local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (pair<int,_OpenMD::BendType_*> *)0x0;
  local_b8 = (pair<int,_OpenMD::BendType_*> *)0x0;
  iStack_b0._M_current = (pair<int,_OpenMD::BendType_*> *)0x0;
  this_00 = &this->data_;
  p_Var6 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  while (bVar2 = replaceWithWildCard(&local_98,keys,&local_68,wildCard), bVar2) {
    iVar3 = std::
            _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>_>
            ::find(&this_00->_M_t,&local_68);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var6) {
      if (iStack_b0._M_current == local_a8) {
        std::
        vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>::
        _M_realloc_insert<std::pair<int,OpenMD::BendType*>const&>
                  ((vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>
                    *)&local_b8,iStack_b0,
                   (pair<int,_OpenMD::BendType_*> *)&iVar3._M_node[1]._M_right);
      }
      else {
        pBVar1 = *(BendType **)(iVar3._M_node + 2);
        *(_Base_ptr *)iStack_b0._M_current = iVar3._M_node[1]._M_right;
        (iStack_b0._M_current)->second = pBVar1;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,keys);
  pbVar8 = local_80.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  pbVar9 = local_80.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < pbVar8 &&
      local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::swap((string *)pbVar9);
      pbVar9 = pbVar9 + 1;
      pbVar8 = pbVar8 + -1;
    } while (pbVar9 < pbVar8);
  }
  pbVar8 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)(keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) ||
     (bVar2 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pbVar8), !bVar2)) {
    if (local_98.
        super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_98.
        super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_98.
      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    while (bVar2 = replaceWithWildCard(&local_98,&local_80,&local_68,wildCard), bVar2) {
      iVar3 = std::
              _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>_>
              ::find(&this_00->_M_t,&local_68);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var6) {
        if (iStack_b0._M_current == local_a8) {
          std::
          vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>
          ::_M_realloc_insert<std::pair<int,OpenMD::BendType*>const&>
                    ((vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>
                      *)&local_b8,iStack_b0,
                     (pair<int,_OpenMD::BendType_*> *)&iVar3._M_node[1]._M_right);
        }
        else {
          pBVar1 = *(BendType **)(iVar3._M_node + 2);
          *(_Base_ptr *)iStack_b0._M_current = iVar3._M_node[1]._M_right;
          (iStack_b0._M_current)->second = pBVar1;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,3,wildCard,&local_b9);
    iVar3 = std::
            _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>_>
            ::find(&this_00->_M_t,&local_48);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var6) {
      if (iStack_b0._M_current == local_a8) {
        std::
        vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>::
        _M_realloc_insert<std::pair<int,OpenMD::BendType*>const&>
                  ((vector<std::pair<int,OpenMD::BendType*>,std::allocator<std::pair<int,OpenMD::BendType*>>>
                    *)&local_b8,iStack_b0,
                   (pair<int,_OpenMD::BendType_*> *)&iVar3._M_node[1]._M_right);
      }
      else {
        pBVar1 = *(BendType **)(iVar3._M_node + 2);
        *(_Base_ptr *)iStack_b0._M_current = iVar3._M_node[1]._M_right;
        (iStack_b0._M_current)->second = pBVar1;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  ppVar5 = local_b8 + 1;
  ppVar4 = local_b8;
  if (ppVar5 != iStack_b0._M_current && local_b8 != iStack_b0._M_current) {
    do {
      if ((ppVar5->first < ppVar4->first) ||
         ((ppVar5->first <= ppVar4->first && (ppVar5->second < ppVar4->second)))) {
        ppVar4 = ppVar5;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != iStack_b0._M_current);
  }
  if (ppVar4 == iStack_b0._M_current) {
    pBVar7 = (ElemPtr)0x0;
  }
  else {
    pBVar7 = ppVar4->second;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if (local_b8 != (pair<int,_OpenMD::BendType_*> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if (local_98.
      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar7;
}

Assistant:

ElemPtr find(KeyType& keys, const std::string& wildCard) {
      assert(keys.size() == SIZE);

      std::vector<KeyTypeIterator> iterCont;
      KeyType replacedKey;
      MapTypeIterator i;
      std::vector<ValueType> foundTypes;

      while (replaceWithWildCard(iterCont, keys, replacedKey, wildCard)) {
        i = data_.find(replacedKey);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      // reverse the order of keys
      KeyType reversedKeys = keys;
      std::reverse(reversedKeys.begin(), reversedKeys.end());

      // if the reversedKeys is the same as keys, just skip it
      if (reversedKeys != keys) {
        // empty the iterator container
        iterCont.clear();

        while (replaceWithWildCard(iterCont, reversedKeys, replacedKey,
                                   wildCard)) {
          i = data_.find(replacedKey);
          if (i != data_.end()) { foundTypes.push_back(i->second); }
        }

        // replaceWithWildCard can not generate this particular sequence, we
        // have to do it manually
        KeyType allWildCards(SIZE, wildCard);
        i = data_.find(allWildCards);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      typename std::vector<ValueType>::iterator j;
      j = std::min_element(foundTypes.begin(), foundTypes.end());
      return j == foundTypes.end() ? NULL : j->second;
    }